

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

void __thiscall OpenMD::ZConstraintForceModifier::doZconstraintForce(ZConstraintForceModifier *this)

{
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *plVar1;
  long lVar2;
  Molecule *pMVar3;
  ZConstraintForceModifier *this_00;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  pointer ppMVar6;
  pointer ppSVar7;
  StuntDouble *pSVar8;
  undefined8 *puVar9;
  _List_node_base *p_Var10;
  Vector3d force;
  double local_90;
  ZConstraintForceModifier *local_88;
  double local_80;
  Vector<double,_3U> local_78;
  _List_node_base *local_60;
  double local_58;
  undefined8 uStack_50;
  Vector<double,_3U> local_48;
  
  p_Var5 = (_List_node_base *)&this->fixedZMols_;
  local_80 = 0.0;
  p_Var4 = p_Var5;
  while (p_Var4 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != p_Var5) {
    lVar2 = (long)p_Var4[1]._M_next;
    p_Var4[3]._M_next = (_List_node_base *)0x0;
    puVar9 = *(undefined8 **)(lVar2 + 0xa0);
    p_Var10 = (_List_node_base *)0x0;
    if (puVar9 != *(undefined8 **)(lVar2 + 0xa8)) goto LAB_001e2be9;
    pSVar8 = (StuntDouble *)0x0;
    while (pSVar8 != (StuntDouble *)0x0) {
      StuntDouble::getFrc((Vector3d *)&local_78,pSVar8);
      p_Var10 = (_List_node_base *)(local_78.data_[2] + (double)p_Var4[3]._M_next);
      p_Var4[3]._M_next = p_Var10;
      puVar9 = puVar9 + 1;
      pSVar8 = (StuntDouble *)0x0;
      if (puVar9 != *(undefined8 **)(lVar2 + 0xa8)) {
LAB_001e2be9:
        pSVar8 = (StuntDouble *)*puVar9;
      }
    }
    local_80 = local_80 + (double)p_Var10;
  }
  local_88 = this;
  local_60 = p_Var5;
  while (p_Var5 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != local_60) {
    pMVar3 = (Molecule *)p_Var5[1]._M_next;
    ppSVar7 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (ppSVar7 ==
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar8 = (StuntDouble *)0x0;
      }
      else {
        pSVar8 = *ppSVar7;
      }
      ppSVar7 = ppSVar7 + 1;
      if (pSVar8 == (StuntDouble *)0x0) break;
      local_90 = 0.0;
      Vector<double,_3U>::Vector(&local_48,&local_90);
      Vector<double,_3U>::Vector(&local_78,&local_48);
      local_58 = -pSVar8->mass_ * (double)p_Var5[3]._M_next;
      uStack_50 = 0x8000000000000000;
      local_78.data_[2] = Molecule::getMass(pMVar3);
      local_78.data_[2] = local_58 / local_78.data_[2];
      StuntDouble::addFrc(pSVar8,(Vector3d *)&local_78);
    }
  }
  plVar1 = &local_88->movingZMols_;
  p_Var5 = (_List_node_base *)plVar1;
  while (p_Var5 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)plVar1) {
    pMVar3 = (Molecule *)p_Var5[1]._M_next;
    local_90 = 0.0;
    Vector<double,_3U>::Vector(&local_48,&local_90);
    Vector<double,_3U>::Vector(&local_78,&local_48);
    local_78.data_[2] = getZFOfMovingMols(local_88,pMVar3,local_80);
    local_78.data_[2] = -local_78.data_[2];
    ppSVar7 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar7 !=
        (pMVar3->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001e2d40;
    pSVar8 = (StuntDouble *)0x0;
    while (pSVar8 != (StuntDouble *)0x0) {
      StuntDouble::addFrc(pSVar8,(Vector3d *)&local_78);
      ppSVar7 = ppSVar7 + 1;
      pSVar8 = (StuntDouble *)0x0;
      if (ppSVar7 !=
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001e2d40:
        pSVar8 = *ppSVar7;
      }
    }
  }
  for (ppMVar6 = (local_88->unzconsMols_).
                 super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl
                 .super__Vector_impl_data._M_start; this_00 = local_88,
      ppMVar6 !=
      (local_88->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar6 = ppMVar6 + 1) {
    pMVar3 = *ppMVar6;
    local_90 = 0.0;
    Vector<double,_3U>::Vector(&local_48,&local_90);
    Vector<double,_3U>::Vector(&local_78,&local_48);
    local_78.data_[2] = getZFOfMovingMols(this_00,pMVar3,local_80);
    local_78.data_[2] = -local_78.data_[2];
    ppSVar7 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar7 !=
        (pMVar3->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001e2dd6;
    pSVar8 = (StuntDouble *)0x0;
    while (pSVar8 != (StuntDouble *)0x0) {
      StuntDouble::addFrc(pSVar8,(Vector3d *)&local_78);
      ppSVar7 = ppSVar7 + 1;
      pSVar8 = (StuntDouble *)0x0;
      if (ppSVar7 !=
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001e2dd6:
        pSVar8 = *ppSVar7;
      }
    }
  }
  return;
}

Assistant:

void ZConstraintForceModifier::doZconstraintForce() {
    RealType totalFZ(0.0);

    // Calculate the total z-contraint force on the fixed molecules:

    std::list<ZconstraintMol>::iterator i;
    Molecule* mol;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;

    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol   = i->mol;
      i->fz = 0.0;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        i->fz += (sd->getFrc())[whichDirection];
      }

      totalFZ += i->fz;
    }

#ifdef IS_MPI
    // collect the total z-constraint force
    MPI_Allreduce(MPI_IN_PLACE, &totalFZ, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // apply negative force to fixed z-constrained molecules:
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol = i->mol;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        Vector3d force(0.0);
        force[whichDirection] = -getZFOfFixedZMols(mol, sd, i->fz);

        sd->addFrc(force);
      }
    }

    // modify the forces of the currently moving z-constrained
    // molecules so that system stays fixed:
    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol = i->mol;

      Vector3d force(0.0);
      force[whichDirection] = -getZFOfMovingMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }

    // modify the forces of unconstrained molecules so that the system
    // stays fixed:
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol = *j;

      Vector3d force(0.0);
      force[whichDirection] = -getZFOfMovingMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }
  }